

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O2

void __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::set_quo_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t slot_id,uint64_t quo)

{
  uint64_t uVar1;
  
  uVar1 = compact_vector::get(&this->table_,slot_id);
  compact_vector::set(&this->table_,slot_id,
                      quo << ((ulong)(byte)this->quo_shift_ & 0x3f) | uVar1 & this->quo_invmask_);
  return;
}

Assistant:

void set_quo_(uint64_t slot_id, uint64_t quo) {
        assert(quo < quo_size_.size());
        table_.set(slot_id, (table_.get(slot_id) & quo_invmask_) | (quo << quo_shift_));
    }